

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeUnsignedInteger
          (ParserImpl *this,uint64_t *value,uint64_t max_value)

{
  bool bVar1;
  Token *pTVar2;
  AlphaNum *in_RCX;
  AlphaNum *in_R8;
  AlphaNum local_188;
  AlphaNum local_158;
  AlphaNum local_128;
  string local_f8;
  string_view local_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  string local_58;
  string_view local_38;
  uint64_t local_28;
  uint64_t max_value_local;
  uint64_t *value_local;
  ParserImpl *this_local;
  
  local_28 = max_value;
  max_value_local = (uint64_t)value;
  value_local = (uint64_t *)this;
  bVar1 = LookingAtType(this,TYPE_INTEGER);
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    bVar1 = io::Tokenizer::ParseInteger(&pTVar2->text,local_28,(uint64_t *)max_value_local);
    if (bVar1) {
      io::Tokenizer::Next(&this->tokenizer_);
      this_local._7_1_ = true;
    }
    else {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_128,"Integer out of range (");
      pTVar2 = io::Tokenizer::current(&this->tokenizer_);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_158,&pTVar2->text);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_188,")");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_f8,(lts_20250127 *)&local_128,&local_158,&local_188,in_R8);
      local_d8 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f8);
      ReportError(this,local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      this_local._7_1_ = false;
    }
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_88,"Expected integer, got: ");
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_b8,&pTVar2->text);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_58,(lts_20250127 *)&local_88,&local_b8,in_RCX);
    local_38 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
    ReportError(this,local_38);
    std::__cxx11::string::~string((string *)&local_58);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ConsumeUnsignedInteger(uint64_t* value, uint64_t max_value) {
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      ReportError(
          absl::StrCat("Expected integer, got: ", tokenizer_.current().text));
      return false;
    }

    if (!io::Tokenizer::ParseInteger(tokenizer_.current().text, max_value,
                                     value)) {
      ReportError(absl::StrCat("Integer out of range (",
                               tokenizer_.current().text, ")"));
      return false;
    }

    tokenizer_.Next();
    return true;
  }